

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GenerateStructBuilderStub
          (PythonStubGenerator *this,stringstream *stub,StructDef *struct_def,Imports *imports)

{
  Definition *pDVar1;
  Imports *struct_def_00;
  bool bVar2;
  ostream *poVar3;
  reference pbVar4;
  string *arg;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  allocator<char> local_49;
  string local_48;
  Imports *local_28;
  Imports *imports_local;
  StructDef *struct_def_local;
  stringstream *stub_local;
  PythonStubGenerator *this_local;
  
  local_28 = imports;
  imports_local = (Imports *)struct_def;
  struct_def_local = (StructDef *)stub;
  stub_local = (stringstream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"flatbuffers",&local_49);
  Imports::Import(imports,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  struct_def_00 = imports_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  StructBuilderArgs(this,(StructDef *)struct_def_00,&local_98,local_28,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::operator<<((ostream *)(struct_def_local->super_Definition).name.field_2._M_local_buf,'\n');
  pDVar1 = &struct_def_local->super_Definition;
  IdlNamer::Type_abi_cxx11_((string *)&__range3,&this->namer_,(StructDef *)imports_local);
  std::operator+(&local_c0,"def Create",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3);
  poVar3 = std::operator<<((ostream *)(pDVar1->name).field_2._M_local_buf,(string *)&local_c0);
  std::operator<<(poVar3,"(builder: flatbuffers.Builder");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&__range3);
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
    poVar3 = std::operator<<((ostream *)
                             (struct_def_local->super_Definition).name.field_2._M_local_buf,", ");
    std::operator<<(poVar3,(string *)pbVar4);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  }
  std::operator<<((ostream *)(struct_def_local->super_Definition).name.field_2._M_local_buf,
                  ") -> uoffset: ...\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  return;
}

Assistant:

void GenerateStructBuilderStub(std::stringstream &stub,
                                 const StructDef *struct_def,
                                 Imports *imports) const {
    imports->Import("flatbuffers");

    std::vector<std::string> args;
    StructBuilderArgs(*struct_def, "", imports, &args);

    stub << '\n';
    stub << "def Create" + namer_.Type(*struct_def)
         << "(builder: flatbuffers.Builder";
    for (const std::string &arg : args) {
      stub << ", " << arg;
    }
    stub << ") -> uoffset: ...\n";
  }